

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alprd_compress.hpp
# Opt level: O0

void __thiscall
duckdb::AlpRDCompressionState<float>::FlushSegment(AlpRDCompressionState<float> *this)

{
  data_ptr_t pdVar1;
  idx_t iVar2;
  AlpRDCompressionState<float> *in_RDI;
  float used_space_percentage;
  idx_t total_segment_size;
  unsigned_long bytes_used_by_metadata;
  idx_t metadata_offset;
  data_ptr_t dataptr;
  ColumnCheckpointState *checkpoint_state;
  BufferHandle *in_stack_ffffffffffffff48;
  ColumnCheckpointState *this_00;
  float local_8c;
  float local_68;
  undefined1 local_58 [24];
  undefined1 local_40 [8];
  uint local_38;
  float local_34;
  idx_t local_30;
  size_t local_28;
  unsigned_long local_20;
  data_ptr_t local_18;
  ColumnCheckpointState *local_10;
  
  local_10 = ColumnDataCheckpointData::GetCheckpointState((ColumnDataCheckpointData *)0xab3b55);
  local_18 = BufferHandle::Ptr((BufferHandle *)0xab3b6b);
  iVar2 = UsedSpace(in_RDI);
  local_20 = AlignValue<unsigned_long,_8UL>(iVar2);
  pdVar1 = local_18;
  iVar2 = CompressionInfo::GetBlockSize((CompressionInfo *)0xab3bad);
  local_28 = UnsafeNumericCast<unsigned_long,long,void>
                       ((long)(pdVar1 + (iVar2 - (long)in_RDI->metadata_ptr)));
  local_30 = CompressionInfo::GetBlockSize((CompressionInfo *)0xab3bdb);
  local_68 = (float)(local_20 + local_28);
  local_8c = (float)local_30;
  local_34 = local_68 / local_8c;
  if (local_34 < 0.8) {
    memmove(local_18 + local_20,in_RDI->metadata_ptr,local_28);
    local_30 = local_20 + local_28;
  }
  local_38 = NumericCast<unsigned_int,unsigned_long,void>(0xab3cfb);
  Store<unsigned_int>(&local_38,local_18);
  local_18 = local_18 + 4;
  Store<unsigned_char>(&(in_RDI->state).right_bit_width,local_18);
  local_18 = local_18 + 1;
  Store<unsigned_char>(&(in_RDI->state).left_bit_width,local_18);
  local_18 = local_18 + 1;
  Store<unsigned_char>(&(in_RDI->state).actual_dictionary_size,local_18);
  local_18 = local_18 + 1;
  memcpy(local_18,(in_RDI->state).left_parts_dict,(ulong)in_RDI->actual_dictionary_size_bytes);
  this_00 = local_10;
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::unique_ptr
            ((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> *)
             local_10,(unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                       *)in_stack_ffffffffffffff48);
  BufferHandle::BufferHandle((BufferHandle *)this_00,in_stack_ffffffffffffff48);
  (*this_00->_vptr_ColumnCheckpointState[4])(this_00,local_40,local_58,local_30);
  BufferHandle::~BufferHandle((BufferHandle *)this_00);
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::~unique_ptr
            ((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> *)
             0xab3e43);
  in_RDI->data_bytes_used = 0;
  in_RDI->vectors_flushed = 0;
  return;
}

Assistant:

void FlushSegment() {
		auto &checkpoint_state = checkpoint_data.GetCheckpointState();
		auto dataptr = handle.Ptr();

		idx_t metadata_offset = AlignValue(UsedSpace());

		// Verify that the metadata_ptr is not smaller than the space used by the data
		D_ASSERT(dataptr + metadata_offset <= metadata_ptr);

		auto bytes_used_by_metadata = UnsafeNumericCast<idx_t>(dataptr + info.GetBlockSize() - metadata_ptr);

		// Initially the total segment size is the size of the block
		auto total_segment_size = info.GetBlockSize();

		//! We compact the block if the space used is less than a threshold
		const auto used_space_percentage =
		    static_cast<float>(metadata_offset + bytes_used_by_metadata) / static_cast<float>(total_segment_size);
		if (used_space_percentage < AlpConstants::COMPACT_BLOCK_THRESHOLD) {
#ifdef DEBUG
			//! Copy the first 4 bytes of the metadata
			uint32_t verify_bytes;
			memcpy((void *)&verify_bytes, metadata_ptr, 4);
#endif
			memmove(dataptr + metadata_offset, metadata_ptr, bytes_used_by_metadata);
#ifdef DEBUG
			//! Now assert that the memmove was correct
			D_ASSERT(verify_bytes == *(uint32_t *)(dataptr + metadata_offset));
#endif
			total_segment_size = metadata_offset + bytes_used_by_metadata;
		}

		// Store the offset to the end of metadata (to be used as a backwards pointer in decoding)
		Store<uint32_t>(NumericCast<uint32_t>(total_segment_size), dataptr);
		dataptr += AlpRDConstants::METADATA_POINTER_SIZE;

		// Store the right bw for the segment
		Store<uint8_t>(state.right_bit_width, dataptr);
		dataptr += AlpRDConstants::RIGHT_BIT_WIDTH_SIZE;

		// Store the left bw for the segment
		Store<uint8_t>(state.left_bit_width, dataptr);
		dataptr += AlpRDConstants::LEFT_BIT_WIDTH_SIZE;

		// Store the actual number of elements on the dictionary of the segment
		Store<uint8_t>(state.actual_dictionary_size, dataptr);
		dataptr += AlpRDConstants::N_DICTIONARY_ELEMENTS_SIZE;

		// Store the Dictionary
		memcpy((void *)dataptr, (void *)state.left_parts_dict, actual_dictionary_size_bytes);

		checkpoint_state.FlushSegment(std::move(current_segment), std::move(handle), total_segment_size);
		data_bytes_used = 0;
		vectors_flushed = 0;
	}